

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int baseCur,int regRowid,int *aRegIdx,int rowidChng,
               int isUpdate,int overrideError,int ignoreDest,int *pbMayReplace)

{
  sqlite3 *db;
  ExprList *pEVar1;
  Index *pIdx;
  char *z;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vdbe *p;
  char *pcVar8;
  Parse *pPVar9;
  Trigger *pTVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  Index **ppIVar16;
  int local_bc;
  StrAccum local_58;
  
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  uVar2 = pTab->nCol;
  iVar12 = regRowid + 1;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  lVar14 = 0;
  for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
    if (uVar13 != (uint)(int)pTab->iPKey) {
      bVar11 = (&pTab->aCol->notNull)[lVar14];
      if (bVar11 != 0) {
        if (bVar11 == 99) {
          bVar11 = 2;
        }
        uVar3 = (uint)bVar11;
        if (overrideError != 99) {
          uVar3 = overrideError;
        }
        iVar4 = (int)uVar13;
        switch(uVar3) {
        case 2:
switchD_00161596_caseD_2:
          pPVar9 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar9 = pParse;
          }
          pPVar9->mayAbort = '\x01';
          uVar3 = 2;
        case 1:
        case 3:
          sqlite3VdbeAddOp3(p,5,0x513,uVar3,iVar12 + iVar4);
          pcVar8 = sqlite3MPrintf(db,"%s.%s may not be NULL",pTab->zName,
                                  *(undefined8 *)((long)&pTab->aCol->zName + lVar14));
          sqlite3VdbeChangeP4(p,-1,pcVar8,-1);
          break;
        case 4:
          sqlite3VdbeAddOp2(p,0x49,iVar12 + iVar4,ignoreDest);
          break;
        case 5:
          if (*(long *)((long)&pTab->aCol->pDflt + lVar14) == 0) goto switchD_00161596_caseD_2;
        default:
          uVar3 = sqlite3VdbeAddOp1(p,0x4a,iVar12 + iVar4);
          sqlite3ExprCode(pParse,*(Expr **)((long)&pTab->aCol->pDflt + lVar14),iVar12 + iVar4);
          if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
            p->aOp[uVar3].p2 = p->nOp;
          }
        }
      }
    }
    lVar14 = lVar14 + 0x30;
  }
  iVar4 = regRowid;
  if (isUpdate != 0 && rowidChng != 0) {
    iVar4 = rowidChng;
  }
  pEVar1 = pTab->pCheck;
  if ((pEVar1 != (ExprList *)0x0) && ((db->flags & 0x400) == 0)) {
    iVar6 = overrideError;
    if (overrideError == 99) {
      iVar6 = 2;
    }
    pParse->ckBase = iVar12;
    lVar15 = 0;
    for (lVar14 = 0; lVar14 < pEVar1->nExpr; lVar14 = lVar14 + 1) {
      uVar3 = sqlite3VdbeMakeLabel(p);
      sqlite3ExprIfTrue(pParse,*(Expr **)((long)&pEVar1->a->pExpr + lVar15),uVar3,8);
      if (iVar6 == 4) {
        sqlite3VdbeAddOp2(p,1,0,ignoreDest);
        iVar6 = 4;
      }
      else {
        if (iVar6 == 5) {
          iVar6 = 2;
        }
        if (*(long *)((long)&pEVar1->a->zName + lVar15) == 0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = sqlite3MPrintf(db,"constraint %s failed");
        }
        sqlite3HaltConstraint(pParse,0x113,iVar6,pcVar8,-1);
      }
      if (p->aLabel != (int *)0x0) {
        p->aLabel[(int)~uVar3] = p->nOp;
      }
      lVar15 = lVar15 + 0x20;
    }
  }
  if (rowidChng == 0) {
    local_bc = 0;
    goto LAB_0016198b;
  }
  uVar3 = overrideError;
  if (overrideError == 99) {
    uVar3 = 2;
    if (pTab->keyConf != 99) {
      uVar3 = (uint)pTab->keyConf;
    }
  }
  if (isUpdate == 0) {
    uVar13 = 0;
  }
  else {
    uVar5 = sqlite3VdbeAddOp3(p,0x4c,regRowid,0,rowidChng);
    uVar13 = (ulong)uVar5;
  }
  local_bc = 0;
  uVar5 = sqlite3VdbeAddOp3(p,0x36,baseCur,0,regRowid);
  if (uVar3 - 1 < 3) {
LAB_00161917:
    sqlite3HaltConstraint(pParse,0x613,uVar3,"PRIMARY KEY must be unique",-2);
  }
  else if (uVar3 == 4) {
    local_bc = 0;
    sqlite3VdbeAddOp2(p,1,0,ignoreDest);
  }
  else {
    if (uVar3 != 5) {
      uVar3 = 2;
      goto LAB_00161917;
    }
    if (((db->flags & 0x20000) == 0) ||
       (pTVar10 = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0),
       pTVar10 == (Trigger *)0x0)) {
      pTVar10 = (Trigger *)0x0;
      iVar6 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
      if (iVar6 == 0) {
        local_bc = 1;
        if (pTab->pIndex != (Index *)0x0) {
          pPVar9 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar9 = pParse;
          }
          pPVar9->isMultiWrite = '\x01';
          sqlite3GenerateRowIndexDelete(pParse,pTab,baseCur,(int *)0x0);
        }
        goto LAB_00161932;
      }
    }
    pPVar9 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar9 = pParse;
    }
    pPVar9->isMultiWrite = '\x01';
    sqlite3GenerateRowDelete(pParse,pTab,baseCur,regRowid,0,pTVar10,5);
    local_bc = 1;
  }
LAB_00161932:
  if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
    p->aOp[uVar5].p2 = p->nOp;
  }
  if ((-1 < (int)(uint)uVar13 && isUpdate != 0) && ((uint)uVar13 < (uint)p->nOp)) {
    p->aOp[uVar13].p2 = p->nOp;
  }
LAB_0016198b:
  lVar14 = 0;
  ppIVar16 = &pTab->pIndex;
  while (pIdx = *ppIVar16, pIdx != (Index *)0x0) {
    if (aRegIdx[lVar14] != 0) {
      iVar6 = sqlite3GetTempRange(pParse,pIdx->nColumn + 1);
      for (uVar13 = 0; uVar13 < pIdx->nColumn; uVar13 = uVar13 + 1) {
        iVar7 = iVar12 + pIdx->aiColumn[uVar13];
        if (pIdx->aiColumn[uVar13] == (int)pTab->iPKey) {
          iVar7 = regRowid;
        }
        sqlite3VdbeAddOp2(p,0xf,iVar7,iVar6 + (int)uVar13);
      }
      sqlite3VdbeAddOp2(p,0xf,regRowid,(int)uVar13 + iVar6);
      sqlite3VdbeAddOp3(p,0x1f,iVar6,pIdx->nColumn + 1,aRegIdx[lVar14]);
      pcVar8 = sqlite3IndexAffinityStr(p,pIdx);
      sqlite3VdbeChangeP4(p,-1,pcVar8,0);
      sqlite3ExprCacheRemove(pParse,iVar6,pIdx->nColumn + 1);
      bVar11 = pIdx->onError;
      if (bVar11 == 0) {
        sqlite3ReleaseTempRange(pParse,iVar6,pIdx->nColumn + 1);
      }
      else {
        if (bVar11 == 99) {
          bVar11 = 2;
        }
        uVar3 = (uint)bVar11;
        if (overrideError != 99) {
          uVar3 = overrideError;
        }
        uVar5 = uVar3;
        if (((local_bc != 0) && (uVar5 = 5, uVar3 != 4)) && (uVar5 = uVar3, uVar3 == 3)) {
          uVar5 = 2;
        }
        iVar7 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(p,0xf,iVar4,iVar7);
        uVar3 = sqlite3VdbeAddOp4(p,0x35,baseCur + 1 + (int)lVar14,0,iVar7,(char *)(long)iVar6,-0xe)
        ;
        sqlite3ReleaseTempRange(pParse,iVar6,pIdx->nColumn + 1);
        if (uVar5 - 1 < 3) {
          local_58.nChar = 0;
          local_58.nAlloc = 0;
          local_58.zBase = (char *)0x0;
          local_58.zText = (char *)0x0;
          local_58.mxAlloc = 200;
          local_58.tooBig = '\0';
          local_58.mallocFailed = '\0';
          local_58.useMalloc = '\x01';
          uVar2 = pIdx->nColumn;
          pcVar8 = "column ";
          if (1 < uVar2) {
            pcVar8 = "columns ";
          }
          local_58.db = db;
          for (uVar13 = 0; uVar13 < uVar2; uVar13 = uVar13 + 1) {
            z = pTab->aCol[pIdx->aiColumn[uVar13]].zName;
            sqlite3StrAccumAppend(&local_58,pcVar8,-1);
            sqlite3StrAccumAppend(&local_58,z,-1);
            uVar2 = pIdx->nColumn;
            pcVar8 = ", ";
          }
          pcVar8 = " is not unique";
          if (1 < uVar2) {
            pcVar8 = " are not unique";
          }
          sqlite3StrAccumAppend(&local_58,pcVar8,-1);
          pcVar8 = sqlite3StrAccumFinish(&local_58);
          sqlite3HaltConstraint(pParse,0x813,uVar5,pcVar8,0);
          sqlite3DbFree(local_58.db,pcVar8);
        }
        else if (uVar5 == 4) {
          sqlite3VdbeAddOp2(p,1,0,ignoreDest);
        }
        else {
          pPVar9 = pParse->pToplevel;
          if (pParse->pToplevel == (Parse *)0x0) {
            pPVar9 = pParse;
          }
          pPVar9->isMultiWrite = '\x01';
          if ((db->flags & 0x20000) == 0) {
            pTVar10 = (Trigger *)0x0;
          }
          else {
            pTVar10 = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0);
          }
          sqlite3GenerateRowDelete(pParse,pTab,baseCur,iVar7,0,pTVar10,5);
          local_bc = 1;
        }
        if ((-1 < (int)uVar3) && (uVar3 < (uint)p->nOp)) {
          p->aOp[uVar3].p2 = p->nOp;
        }
        sqlite3ReleaseTempReg(pParse,iVar7);
      }
    }
    lVar14 = lVar14 + 1;
    ppIVar16 = &pIdx->pNext;
  }
  if (pbMayReplace != (int *)0x0) {
    *pbMayReplace = local_bc;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int baseCur,        /* Index of a read/write cursor pointing at pTab */
  int regRowid,       /* Index of the range of input registers */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int rowidChng,      /* True if the rowid might collide with existing entry */
  int isUpdate,       /* True for UPDATE, False for INSERT */
  int overrideError,  /* Override onError to this if not OE_Default */
  int ignoreDest,     /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace   /* OUT: Set to true if constraint may cause a replace */
){
  int i;              /* loop counter */
  Vdbe *v;            /* VDBE under constrution */
  int nCol;           /* Number of columns */
  int onError;        /* Conflict resolution strategy */
  int j1;             /* Addresss of jump instruction */
  int j2 = 0, j3;     /* Addresses of jump instructions */
  int regData;        /* Register containing first data column */
  int iCur;           /* Table cursor number */
  Index *pIdx;         /* Pointer to one of the indices */
  sqlite3 *db;         /* Database connection */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int regOldRowid = (rowidChng && isUpdate) ? rowidChng : regRowid;

  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  regData = regRowid + 1;

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Abort:
        sqlite3MayAbort(pParse);
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg;
        sqlite3VdbeAddOp3(v, OP_HaltIfNull,
                          SQLITE_CONSTRAINT_NOTNULL, onError, regData+i);
        zMsg = sqlite3MPrintf(db, "%s.%s may not be NULL",
                              pTab->zName, pTab->aCol[i].zName);
        sqlite3VdbeChangeP4(v, -1, zMsg, P4_DYNAMIC);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_IsNull, regData+i, ignoreDest);
        break;
      }
      default: {
        assert( onError==OE_Replace );
        j1 = sqlite3VdbeAddOp1(v, OP_NotNull, regData+i);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regData+i);
        sqlite3VdbeJumpHere(v, j1);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->ckBase = regData;
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk = sqlite3VdbeMakeLabel(v);
      sqlite3ExprIfTrue(pParse, pCheck->a[i].pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
      }else{
        char *zConsName = pCheck->a[i].zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        if( zConsName ){
          zConsName = sqlite3MPrintf(db, "constraint %s failed", zConsName);
        }else{
          zConsName = 0;
        }
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zConsName, P4_DYNAMIC);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If we have an INTEGER PRIMARY KEY, make sure the primary key
  ** of the new record does not previously exist.  Except, if this
  ** is an UPDATE and the primary key is not changing, that is OK.
  */
  if( rowidChng ){
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    
    if( isUpdate ){
      j2 = sqlite3VdbeAddOp3(v, OP_Eq, regRowid, 0, rowidChng);
    }
    j3 = sqlite3VdbeAddOp3(v, OP_NotExists, baseCur, 0, regRowid);
    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_PRIMARYKEY,
           onError, "PRIMARY KEY must be unique", P4_STATIC);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(
              pParse, pTab, baseCur, regRowid, 0, pTrigger, OE_Replace
          );
        }else if( pTab->pIndex ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowIndexDelete(pParse, pTab, baseCur, 0);
        }
        seenReplace = 1;
        break;
      }
      case OE_Ignore: {
        assert( seenReplace==0 );
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
    }
    sqlite3VdbeJumpHere(v, j3);
    if( isUpdate ){
      sqlite3VdbeJumpHere(v, j2);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Add the new records to the indices as we go.
  */
  for(iCur=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, iCur++){
    int regIdx;
    int regR;

    if( aRegIdx[iCur]==0 ) continue;  /* Skip unused indices */

    /* Create a key for accessing the index entry */
    regIdx = sqlite3GetTempRange(pParse, pIdx->nColumn+1);
    for(i=0; i<pIdx->nColumn; i++){
      int idx = pIdx->aiColumn[i];
      if( idx==pTab->iPKey ){
        sqlite3VdbeAddOp2(v, OP_SCopy, regRowid, regIdx+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_SCopy, regData+idx, regIdx+i);
      }
    }
    sqlite3VdbeAddOp2(v, OP_SCopy, regRowid, regIdx+i);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn+1, aRegIdx[iCur]);
    sqlite3VdbeChangeP4(v, -1, sqlite3IndexAffinityStr(v, pIdx), P4_TRANSIENT);
    sqlite3ExprCacheAffinityChange(pParse, regIdx, pIdx->nColumn+1);

    /* Find out what action to take in case there is an indexing conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn+1);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( seenReplace ){
      if( onError==OE_Ignore ) onError = OE_Replace;
      else if( onError==OE_Fail ) onError = OE_Abort;
    }
    
    /* Check to see if the new index entry will be unique */
    regR = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp2(v, OP_SCopy, regOldRowid, regR);
    j3 = sqlite3VdbeAddOp4(v, OP_IsUnique, baseCur+iCur+1, 0,
                           regR, SQLITE_INT_TO_PTR(regIdx),
                           P4_INT32);
    sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn+1);

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        int j;
        StrAccum errMsg;
        const char *zSep;
        char *zErr;

        sqlite3StrAccumInit(&errMsg, 0, 0, 200);
        errMsg.db = db;
        zSep = pIdx->nColumn>1 ? "columns " : "column ";
        for(j=0; j<pIdx->nColumn; j++){
          char *zCol = pTab->aCol[pIdx->aiColumn[j]].zName;
          sqlite3StrAccumAppend(&errMsg, zSep, -1);
          zSep = ", ";
          sqlite3StrAccumAppend(&errMsg, zCol, -1);
        }
        sqlite3StrAccumAppend(&errMsg,
            pIdx->nColumn>1 ? " are not unique" : " is not unique", -1);
        zErr = sqlite3StrAccumFinish(&errMsg);
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_UNIQUE,
                              onError, zErr, 0);
        sqlite3DbFree(errMsg.db, zErr);
        break;
      }
      case OE_Ignore: {
        assert( seenReplace==0 );
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        sqlite3MultiWrite(pParse);
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        sqlite3GenerateRowDelete(
            pParse, pTab, baseCur, regR, 0, pTrigger, OE_Replace
        );
        seenReplace = 1;
        break;
      }
    }
    sqlite3VdbeJumpHere(v, j3);
    sqlite3ReleaseTempReg(pParse, regR);
  }
  
  if( pbMayReplace ){
    *pbMayReplace = seenReplace;
  }
}